

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall
mkvparser::Cluster::Cluster(Cluster *this,Segment *pSegment,long idx,longlong element_start)

{
  longlong element_start_local;
  long idx_local;
  Segment *pSegment_local;
  Cluster *this_local;
  
  this->m_pSegment = pSegment;
  this->m_element_start = element_start;
  this->m_index = idx;
  this->m_pos = element_start;
  this->m_element_size = -1;
  this->m_timecode = -1;
  this->m_entries = (BlockEntry **)0x0;
  this->m_entries_size = 0;
  this->m_entries_count = -1;
  return;
}

Assistant:

Cluster::Cluster(Segment* pSegment, long idx, long long element_start
                 /* long long element_size */)
    : m_pSegment(pSegment),
      m_element_start(element_start),
      m_index(idx),
      m_pos(element_start),
      m_element_size(-1 /* element_size */),
      m_timecode(-1),
      m_entries(NULL),
      m_entries_size(0),
      m_entries_count(-1)  // means "has not been parsed yet"
{}